

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwlock_test.cpp
# Opt level: O0

void __thiscall
SharedMutexTest_TryLockSharedFail_Test<yamc::alternate::basic_shared_mutex<yamc::rwlock::WriterPrefer>_>
::SharedMutexTest_TryLockSharedFail_Test
          (SharedMutexTest_TryLockSharedFail_Test<yamc::alternate::basic_shared_mutex<yamc::rwlock::WriterPrefer>_>
           *this)

{
  SharedMutexTest_TryLockSharedFail_Test<yamc::alternate::basic_shared_mutex<yamc::rwlock::WriterPrefer>_>
  *this_local;
  
  SharedMutexTest<yamc::alternate::basic_shared_mutex<yamc::rwlock::WriterPrefer>_>::SharedMutexTest
            (&this->
              super_SharedMutexTest<yamc::alternate::basic_shared_mutex<yamc::rwlock::WriterPrefer>_>
            );
  (this->super_SharedMutexTest<yamc::alternate::basic_shared_mutex<yamc::rwlock::WriterPrefer>_>).
  super_Test._vptr_Test = (_func_int **)&PTR__SharedMutexTest_TryLockSharedFail_Test_0044ba00;
  return;
}

Assistant:

TYPED_TEST(SharedMutexTest, TryLockSharedFail)
{
  yamc::test::barrier step(1 + TEST_READER_THREADS);
  TypeParam mtx;
  yamc::test::task_runner(
    1 + TEST_READER_THREADS,
    [&](std::size_t id) {
      if (id == 0) {
        // writer-threads
        ASSERT_NO_THROW(mtx.lock());
        step.await();  // b1
        step.await();  // b2
        ASSERT_NO_THROW(mtx.unlock());
      } else {
        // reader-threads
        step.await();  // b1
        EXPECT_FALSE(mtx.try_lock_shared());
        step.await();  // b2
      }
    });
}